

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O3

bool pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
               (int *a,int *b,double rest,double rest_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_3)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  if (*a == *b) {
    pcVar1 = (rest_2->_M_dataplus)._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + rest_2->_M_string_length);
    pcVar1 = (rest_3->_M_dataplus)._M_p;
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + rest_3->_M_string_length);
    if (((rest != rest_1) || (NAN(rest) || NAN(rest_1))) || (local_50 != local_30)) {
      bVar3 = false;
    }
    else if (local_50 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_58,local_38,local_50);
      bVar3 = iVar2 == 0;
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
pairwise_equal(A const& a, A const& b)
{
    return (a == b);
}